

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *pFVar1;
  double *pdVar2;
  qpTestLog *pqVar3;
  _Rb_tree_node_base *p_Var4;
  ostringstream *poVar5;
  float fVar6;
  Precision PVar7;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar8;
  Statement *pSVar9;
  ShaderExecutor *pSVar10;
  Variable<tcu::Vector<float,_2>_> *pVVar11;
  pointer pcVar12;
  Variable<float> *pVVar13;
  double dVar14;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  *pBVar15;
  TestLog *pTVar16;
  TestStatus *pTVar17;
  pointer pVVar18;
  bool bVar19;
  int iVar20;
  _Rb_tree_node_base *p_Var21;
  long lVar22;
  IVal *pIVar23;
  IVal *x;
  undefined8 *puVar24;
  uint uVar25;
  long lVar26;
  char *pcVar27;
  qpTestLog *pqVar28;
  TestLog TVar29;
  float afVar30 [2];
  long lVar31;
  IVal IVar32;
  double dVar33;
  IVal reference1;
  FuncSet funcs;
  IVal in2;
  IVal in3;
  Environment env;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> outputs;
  IVal in0;
  void *outputArr [2];
  FloatFormat highpFmt;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  deUint32 in_stack_fffffffffffffab8;
  IVal local_539;
  TestLog *local_538;
  undefined1 local_530 [32];
  _Rb_tree_node_base *local_510;
  size_t local_508;
  size_t local_500;
  Vector<float,_2> *local_4f8;
  string local_4f0;
  BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>
  *local_4d0;
  TestLog *local_4c8;
  double dStack_4c0;
  qpTestLog *local_4b8;
  long local_4b0;
  TestStatus *local_4a8;
  FloatFormat *local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_498;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_> local_468;
  undefined1 local_438 [16];
  TestLog local_428;
  Interval IStack_420;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_408;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  pointer local_2b8;
  pointer local_2b0;
  FloatFormat local_2a8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  local_278;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  IVal local_1f8 [2];
  ios_base local_188 [264];
  ResultCollector local_80;
  Vector<float,_2> *val;
  
  this_00 = this->m_samplings;
  pFVar1 = &(this->m_caseCtx).floatFormat;
  PVar7 = (this->m_caseCtx).precision;
  sVar8 = (this->m_caseCtx).numRandoms;
  local_4a8 = __return_storage_ptr__;
  iVar20 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4a0 = pFVar1;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,2>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&local_278,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_2>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)pFVar1,(FloatFormat *)(ulong)PVar7,(Precision)sVar8,(ulong)(iVar20 + 0xdeadbeef),
             in_stack_fffffffffffffab8);
  pVVar18 = local_278.in0.
            super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_500 = (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
  Outputs<vkt::shaderexecutor::OutTypes<float,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_468,local_500);
  local_2a8.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_2a8.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_2a8.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_2a8.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_2a8.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_2a8.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_2a8.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_2a8.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_2a8._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_498._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_498._M_impl.super__Rb_tree_header._M_header;
  local_498._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_498._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_498._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_498._M_impl.super__Rb_tree_header._M_header._M_right =
       local_498._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_538 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_278.in0.
              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_278.in1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_208 = local_278.in2.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_200 = local_278.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_2b8 = local_468.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_2b0 = local_468.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar5 = (ostringstream *)(local_438 + 8);
  local_438._0_8_ = local_538;
  std::__cxx11::ostringstream::ostringstream(poVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar5,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  p_Var4 = (_Rb_tree_node_base *)(local_530 + 8);
  local_530._8_4_ = _S_red;
  local_530._16_8_ = (qpTestLog *)0x0;
  local_508 = 0;
  pSVar9 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_530._24_8_ = p_Var4;
  local_510 = p_Var4;
  (*pSVar9->_vptr_Statement[4])(pSVar9,local_530);
  if ((_Rb_tree_node_base *)local_530._24_8_ != p_Var4) {
    p_Var21 = (_Rb_tree_node_base *)local_530._24_8_;
    do {
      (**(code **)(**(long **)(p_Var21 + 1) + 0x30))(*(long **)(p_Var21 + 1),local_1f8);
      p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
    } while (p_Var21 != p_Var4);
  }
  if (local_508 != 0) {
    poVar5 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar5,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_530);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar10 = (this->m_executor).
            super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
            .m_data.ptr;
  (*pSVar10->_vptr_ShaderExecutor[2])(pSVar10,local_500,&local_218,&local_2b8,0);
  lVar22 = 0x10;
  do {
    local_438[lVar22 + -0x10] = 0;
    *(undefined8 *)(local_438 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_438 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 != 0x40);
  lVar22 = 0x10;
  do {
    local_438[lVar22 + -0x10] = 0;
    *(undefined8 *)(local_438 + lVar22 + -8) = 0x7ff0000000000000;
    *(undefined8 *)(local_438 + lVar22) = 0xfff0000000000000;
    lVar22 = lVar22 + 0x18;
  } while (lVar22 == 0x28);
  local_1f8[0].m_data[0]._0_8_ = local_1f8[0].m_data[0]._0_8_ & 0xffffffffffffff00;
  local_1f8[0].m_data[0].m_lo = INFINITY;
  local_1f8[0].m_data[0].m_hi = -INFINITY;
  Environment::bind<tcu::Vector<float,2>>
            ((Environment *)&local_498,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)local_530);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in2.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4f0);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4c8);
  Environment::bind<float>
            ((Environment *)&local_498,
             (this->m_variables).out0.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,local_1f8[0].m_data);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_498,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_539);
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar18) {
    local_4f8 = (Vector<float,_2> *)0x0;
  }
  else {
    lVar22 = local_500 + (local_500 == 0);
    lVar26 = 0;
    lVar31 = 0;
    local_4f8 = (Vector<float,_2> *)0x0;
    local_4d0 = this;
    do {
      pFVar1 = local_4a0;
      local_4c8 = (TestLog *)((ulong)local_4c8 & 0xffffffffffffff00);
      dStack_4c0 = INFINITY;
      local_4b8 = (qpTestLog *)0xfff0000000000000;
      local_530._0_8_ =
           *(float (*) [2])
            ((long)(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar31);
      local_4b0 = lVar22;
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
                (local_1f8,local_4a0,(Vector<float,_2> *)local_530);
      ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doConvert
                ((IVal *)local_438,pFVar1,local_1f8);
      pIVar23 = Environment::lookup<tcu::Vector<float,2>>
                          ((Environment *)&local_498,
                           (local_4d0->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>
                           .m_ptr);
      pBVar15 = local_4d0;
      pIVar23->m_data[1].m_lo = IStack_420.m_lo;
      pIVar23->m_data[1].m_hi = (double)CONCAT44(IStack_420.m_hi._4_4_,IStack_420.m_hi._0_4_);
      pIVar23->m_data[0].m_hi = (double)local_428.m_log;
      pIVar23->m_data[1].m_hasNaN = IStack_420.m_hasNaN;
      *(undefined7 *)&pIVar23->m_data[1].field_0x1 = IStack_420._1_7_;
      *(undefined8 *)pIVar23->m_data = local_438._0_8_;
      pIVar23->m_data[0].m_lo = (double)CONCAT44(local_438._12_4_,local_438._8_4_);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (local_4d0->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar15->m_variables).in2.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_498,
                 (pBVar15->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      IStack_420.m_hi._0_4_ = (pBVar15->m_caseCtx).precision;
      IStack_420.m_lo = pFVar1->m_maxValue;
      local_438._0_8_ = *(undefined8 *)pFVar1;
      local_438._8_4_ = pFVar1->m_fractionBits;
      local_438._12_4_ = pFVar1->m_hasSubnormal;
      local_428.m_log = *(qpTestLog **)&pFVar1->m_hasInf;
      IStack_420.m_hasNaN = pFVar1->m_exactPrecision;
      IStack_420._1_7_ = *(undefined7 *)&pFVar1->field_0x19;
      local_400 = 0;
      pSVar9 = (pBVar15->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_408 = &local_498;
      (*pSVar9->_vptr_Statement[3])(pSVar9,(MessageBuilder *)local_438);
      x = Environment::lookup<float>
                    ((Environment *)&local_498,
                     (pBVar15->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      poVar5 = (ostringstream *)(local_438 + 8);
      tcu::FloatFormat::convert((Interval *)local_438,&local_2a8,x);
      local_4b8 = local_428.m_log;
      dStack_4c0 = (double)CONCAT44(local_438._12_4_,local_438._8_4_);
      local_4c8 = (TestLog *)local_438._0_8_;
      pTVar16 = local_4c8;
      fVar6 = *(float *)((long)local_468.out0.super__Vector_base<float,_std::allocator<float>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar26);
      dVar33 = (double)fVar6;
      dVar14 = dVar33;
      if (NAN(fVar6)) {
        dVar14 = INFINITY;
        dVar33 = -INFINITY;
      }
      IVar32 = (IVal)(dVar33 <= (double)local_428.m_log && dStack_4c0 <= dVar14);
      if ((NAN(fVar6)) && (dVar33 <= (double)local_428.m_log && dStack_4c0 <= dVar14)) {
        local_4c8._0_1_ = SUB81(local_438._0_8_,0);
        IVar32 = local_4c8._0_1_;
      }
      local_438._0_8_ = &local_428;
      local_4c8 = pTVar16;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar19 = tcu::ResultCollector::check(&local_80,(bool)((byte)IVar32 & 1),(string *)local_438);
      if ((TestLog *)local_438._0_8_ != &local_428) {
        operator_delete((void *)local_438._0_8_,(ulong)((long)&(local_428.m_log)->flags + 1));
      }
      uVar25 = (int)local_4f8 + ((byte)~bVar19 & 1);
      val = (Vector<float,_2> *)(ulong)uVar25;
      local_4f8 = val;
      if ((int)uVar25 < 0x65 && !bVar19) {
        local_438._0_8_ = local_538;
        std::__cxx11::ostringstream::ostringstream(poVar5);
        pBVar15 = local_4d0;
        pcVar27 = "Failed";
        if (bVar19) {
          pcVar27 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,pcVar27,6);
        pdVar2 = &local_1f8[0].m_data[0].m_hi;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar11 = (pBVar15->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_2>_>_>.
                  m_ptr;
        pcVar12 = (pVVar11->m_name)._M_dataplus._M_p;
        local_1f8[0].m_data[0]._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,pcVar12,pcVar12 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_1f8[0].m_data[0]._0_8_,
                   (long)local_1f8[0].m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<tcu::Vector<float,2>>
                  ((string *)local_530,(shaderexecutor *)&local_2a8,
                   (FloatFormat *)
                   ((long)(local_278.in0.
                           super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar31),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_530._0_8_,
                   CONCAT44(local_530._12_4_,local_530._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if (local_530._0_8_ != (long)local_530 + 0x10) {
          operator_delete((void *)local_530._0_8_,(ulong)(local_530._16_8_ + 1));
        }
        if ((double *)local_1f8[0].m_data[0]._0_8_ != pdVar2) {
          operator_delete((void *)local_1f8[0].m_data[0]._0_8_,(long)local_1f8[0].m_data[0].m_hi + 1
                         );
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\t",1);
        pVVar13 = (pBVar15->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
        pcVar12 = (pVVar13->m_name)._M_dataplus._M_p;
        local_1f8[0].m_data[0]._0_8_ = pdVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_1f8,pcVar12,pcVar12 + (pVVar13->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_1f8[0].m_data[0]._0_8_,
                   (long)local_1f8[0].m_data[0].m_lo);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," = ",3);
        valueToString<float>
                  ((string *)local_530,&local_2a8,
                   (float *)((long)local_468.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar26));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,(char *)local_530._0_8_,
                   CONCAT44(local_530._12_4_,local_530._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,"\tExpected range: ",0x11);
        intervalToString<float>(&local_4f0,&local_2a8,(IVal *)&local_4c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar5,local_4f0._M_dataplus._M_p,local_4f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
          operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
        }
        if (local_530._0_8_ != (long)local_530 + 0x10) {
          operator_delete((void *)local_530._0_8_,(ulong)(local_530._16_8_ + 1));
        }
        if ((double *)local_1f8[0].m_data[0]._0_8_ != pdVar2) {
          operator_delete((void *)local_1f8[0].m_data[0]._0_8_,(long)local_1f8[0].m_data[0].m_hi + 1
                         );
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar5);
        std::ios_base::~ios_base(local_3c0);
      }
      lVar31 = lVar31 + 8;
      lVar26 = lVar26 + 4;
      lVar22 = local_4b0 + -1;
    } while (lVar22 != 0);
  }
  pTVar17 = local_4a8;
  iVar20 = (int)local_4f8;
  if (100 < iVar20) {
    poVar5 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"(Skipped ",9);
    std::ostream::operator<<(poVar5,iVar20 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar5);
    std::ios_base::~ios_base(local_3c0);
  }
  poVar5 = (ostringstream *)(local_438 + 8);
  if (iVar20 == 0) {
    local_438._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_438._0_8_ = local_538;
    std::__cxx11::ostringstream::ostringstream(poVar5);
    std::ostream::operator<<(poVar5,iVar20);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar5," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream(poVar5);
  std::ios_base::~ios_base(local_3c0);
  if (iVar20 == 0) {
    local_438._0_8_ = &local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Pass","");
    pTVar17->m_code = QP_TEST_RESULT_PASS;
    (pTVar17->m_description)._M_dataplus._M_p = (pointer)&(pTVar17->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar17->m_description,local_438._0_8_,
               CONCAT44(local_438._12_4_,local_438._8_4_) + local_438._0_8_);
    TVar29.m_log = local_428.m_log;
    afVar30 = (float  [2])local_438._0_8_;
    if ((TestLog *)local_438._0_8_ == &local_428) goto LAB_0085ea07;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::ostream::operator<<(local_438,iVar20);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    local_438._0_8_ = &local_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438," test failed. Check log for the details","");
    pqVar3 = (qpTestLog *)
             (CONCAT44(local_438._12_4_,local_438._8_4_) +
             CONCAT44(local_530._12_4_,local_530._8_4_));
    pqVar28 = (qpTestLog *)0xf;
    if (local_530._0_8_ != (long)local_530 + 0x10) {
      pqVar28 = (qpTestLog *)local_530._16_8_;
    }
    if (pqVar28 < pqVar3) {
      TVar29.m_log = (qpTestLog *)0xf;
      if ((TestLog *)local_438._0_8_ != &local_428) {
        TVar29.m_log = local_428.m_log;
      }
      if (TVar29.m_log < pqVar3) goto LAB_0085e89c;
      puVar24 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_438,0,(char *)0x0,local_530._0_8_);
    }
    else {
LAB_0085e89c:
      puVar24 = (undefined8 *)std::__cxx11::string::_M_append(local_530,local_438._0_8_);
    }
    local_1f8[0].m_data[0]._0_8_ = &local_1f8[0].m_data[0].m_hi;
    pdVar2 = (double *)(puVar24 + 2);
    if ((double *)*puVar24 == pdVar2) {
      local_1f8[0].m_data[0].m_hi = *pdVar2;
      local_1f8[0].m_data[1]._0_4_ = *(undefined4 *)(puVar24 + 3);
      local_1f8[0].m_data[1]._4_4_ = *(undefined4 *)((long)puVar24 + 0x1c);
    }
    else {
      local_1f8[0].m_data[0].m_hi = *pdVar2;
      local_1f8[0].m_data[0]._0_8_ = (double *)*puVar24;
    }
    local_1f8[0].m_data[0].m_lo = (double)puVar24[1];
    *puVar24 = pdVar2;
    puVar24[1] = 0;
    *(undefined1 *)pdVar2 = 0;
    pTVar17->m_code = QP_TEST_RESULT_FAIL;
    (pTVar17->m_description)._M_dataplus._M_p = (pointer)&(pTVar17->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar17->m_description,local_1f8[0].m_data[0]._0_8_,
               (undefined1 *)((long)local_1f8[0].m_data[0].m_lo + local_1f8[0].m_data[0]._0_8_));
    if ((double *)local_1f8[0].m_data[0]._0_8_ != &local_1f8[0].m_data[0].m_hi) {
      operator_delete((void *)local_1f8[0].m_data[0]._0_8_,(long)local_1f8[0].m_data[0].m_hi + 1);
    }
    if ((TestLog *)local_438._0_8_ != &local_428) {
      operator_delete((void *)local_438._0_8_,(ulong)((long)&(local_428.m_log)->flags + 1));
    }
    TVar29.m_log = (qpTestLog *)local_530._16_8_;
    afVar30 = (float  [2])local_530._0_8_;
    if (local_530._0_8_ == (long)local_530 + 0x10) goto LAB_0085ea07;
  }
  operator_delete((void *)afVar30,(ulong)((long)&(TVar29.m_log)->flags + 1));
LAB_0085ea07:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_498);
  if (local_468.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_468.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_468.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_468.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_468.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_278.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in2.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in2.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in2.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_278.in0.
      super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.in0.
                    super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.in0.
                          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar17;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}